

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

double __thiscall
duckdb::Interpolator<true>::Operation<double,double,duckdb::QuantileDirect<double>>
          (Interpolator<true> *this,double *v_t,Vector *result,QuantileDirect<double> *accessor)

{
  double *in_RCX;
  Vector *result_00;
  double dVar1;
  double *in_stack_00000028;
  Interpolator<true> *in_stack_00000030;
  
  result_00 = (Vector *)
              InterpolateInternal<double,duckdb::QuantileDirect<double>>
                        (in_stack_00000030,in_stack_00000028,(QuantileDirect<double> *)this);
  dVar1 = CastInterpolation::Cast<double,double>(in_RCX,result_00);
  return dVar1;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}